

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserSamTest_CompressedParseInChunks_Test::TestBody
          (BioparserSamTest_CompressedParseInChunks_Test *this)

{
  Parser<bioparser::test::SamOverlap> *pPVar1;
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  t;
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  local_40;
  
  std::__cxx11::string::string((string *)&t,"sample.sam.gz",(allocator *)&local_40);
  BioparserSamTest::Setup(&this->super_BioparserSamTest,(string *)&t);
  std::__cxx11::string::~string((string *)&t);
  pPVar1 = (this->super_BioparserSamTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<bioparser::test::SamOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::SamOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
           .super__Head_base<0UL,_bioparser::Parser<bioparser::test::SamOverlap>_*,_false>.
           _M_head_impl;
  (*pPVar1->_vptr_Parser[2])(&t,pPVar1,0x400,1);
  while( true ) {
    if (t.
        super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        t.
        super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    std::
    vector<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>,std::allocator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>>>
    ::
    insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>*,std::vector<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>,std::allocator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>>>>>,void>
              ((vector<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>,std::allocator<std::unique_ptr<bioparser::test::SamOverlap,std::default_delete<bioparser::test::SamOverlap>>>>
                *)&(this->super_BioparserSamTest).o,
               (this->super_BioparserSamTest).o.
               super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_*,_std::vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>_>_>
                )t.
                 super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_*,_std::vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>_>_>
                )t.
                 super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    pPVar1 = (this->super_BioparserSamTest).p._M_t.
             super___uniq_ptr_impl<bioparser::Parser<bioparser::test::SamOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::SamOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::SamOverlap>_>_>
             .super__Head_base<0UL,_bioparser::Parser<bioparser::test::SamOverlap>_*,_false>.
             _M_head_impl;
    (*pPVar1->_vptr_Parser[2])(&local_40,pPVar1,0x400,1);
    std::
    vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
    ::_M_move_assign(&t,&local_40);
    std::
    vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
    ::~vector(&local_40);
  }
  std::
  vector<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
  ::~vector(&t);
  BioparserSamTest::Check(&this->super_BioparserSamTest);
  return;
}

Assistant:

TEST_F(BioparserSamTest, CompressedParseInChunks) {
  Setup("sample.sam.gz");
  for (auto t = p->Parse(1024); !t.empty(); t = p->Parse(1024)) {
    o.insert(
        o.end(),
        std::make_move_iterator(t.begin()),
        std::make_move_iterator(t.end()));
  }
  Check();
}